

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngTRNGRead(void *buf,size_t *read,size_t count)

{
  bool_t bVar1;
  int iVar2;
  ulong in_RDX;
  ulong *in_RSI;
  u32 *in_RDI;
  u32 *rand;
  u32 *local_28;
  err_t local_4;
  
  *in_RSI = 0;
  bVar1 = rngTRNGIsAvail();
  if (bVar1 == 0) {
    local_4 = 0xca;
  }
  else {
    local_28 = in_RDI;
    if (in_RDX < 4) {
      local_4 = 0;
    }
    else {
      while (*in_RSI + 4 <= in_RDX) {
        iVar2 = rngRDStep(local_28);
        if (iVar2 == 0) {
          return 0x12e;
        }
        *in_RSI = *in_RSI + 4;
        local_28 = local_28 + 1;
      }
      if (*in_RSI < in_RDX) {
        iVar2 = rngRDStep((u32 *)((long)in_RDI + (in_RDX - 4)));
        if (iVar2 == 0) {
          return 0x12e;
        }
        *in_RSI = in_RDX;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static err_t rngTRNGRead(void* buf, size_t* read, size_t count)
{
	u32* rand = (u32*)buf;
	// pre
	ASSERT(memIsValid(read, O_PER_S));
	ASSERT(memIsValid(buf, count));
	// есть источник?
	*read = 0;
	if (!rngTRNGIsAvail())
		return ERR_FILE_NOT_FOUND;
	// короткий буфер?
	if (count < 4)
		return ERR_OK;
	// генерация
	for (; *read + 4 <= count; *read += 4, ++rand)
		if (!rngRDStep(rand))
			return ERR_BAD_ENTROPY;
	// неполный блок
	if (*read < count)
	{
		rand = (u32*)((octet*)buf + count - 4);
		if (!rngRDStep(rand))
			return ERR_BAD_ENTROPY;
		*read = count;
	}
	return ERR_OK;
}